

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cc
# Opt level: O3

void __thiscall
pstack::InflateReader::InflateReader(InflateReader *this,size_t inflatedSize,Reader *upstream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *data_;
  Exception *pEVar6;
  bool bVar7;
  Reader *things;
  bool bVar8;
  Bytef *pBVar9;
  long lVar10;
  undefined1 local_8248 [8];
  char xferbuf [32768];
  size_type local_240;
  Bytef *local_238;
  undefined1 auStack_a8 [8];
  z_stream stream;
  
  xferbuf._32760_8_ = &stack0xfffffffffffffdc8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(xferbuf + 0x7ff8),"inflated content from ","");
  stringify<pstack::Reader_const&>((string *)auStack_a8,(pstack *)upstream,things);
  pBVar9 = (Bytef *)0xf;
  if ((Bytef **)xferbuf._32760_8_ != &stack0xfffffffffffffdc8) {
    pBVar9 = local_238;
  }
  if (pBVar9 < stream.next_in + local_240) {
    pBVar9 = (Bytef *)0xf;
    if (auStack_a8 != (undefined1  [8])&stream.avail_in) {
      pBVar9 = (Bytef *)stream._8_8_;
    }
    if (stream.next_in + local_240 <= pBVar9) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_a8,0,0,(char *)xferbuf._32760_8_,local_240);
      goto LAB_001626c6;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (xferbuf + 0x7ff8),(char *)auStack_a8,(size_type)stream.next_in);
LAB_001626c6:
  local_8248 = (undefined1  [8])(xferbuf + 8);
  pcVar2 = (pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    xferbuf._8_8_ = paVar1->_M_allocated_capacity;
    xferbuf._16_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    xferbuf._8_8_ = paVar1->_M_allocated_capacity;
    local_8248 = (undefined1  [8])pcVar2;
  }
  xferbuf._0_8_ = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  data_ = (char *)operator_new__(inflatedSize);
  MemReader::MemReader(&this->super_MemReader,(string *)local_8248,inflatedSize,data_);
  if (local_8248 != (undefined1  [8])(xferbuf + 8)) {
    operator_delete((void *)local_8248,xferbuf._8_8_ + 1);
  }
  if (auStack_a8 != (undefined1  [8])&stream.avail_in) {
    operator_delete((void *)auStack_a8,stream._8_8_ + 1);
  }
  if ((Bytef **)xferbuf._32760_8_ != &stack0xfffffffffffffdc8) {
    operator_delete((void *)xferbuf._32760_8_,(ulong)(local_238 + 1));
  }
  (this->super_MemReader).super_Reader._vptr_Reader = (_func_int **)&PTR__InflateReader_0017bb20;
  stream.data_type = 0;
  stream._92_4_ = 0;
  stream.adler = 0;
  stream.zfree = (free_func)0x0;
  stream.opaque = (voidpf)0x0;
  stream.state = (internal_state *)0x0;
  stream.zalloc = (alloc_func)0x0;
  stream.total_out = 0;
  stream.msg = (char *)0x0;
  stream.next_out = (Bytef *)0x0;
  stream.avail_out = 0;
  stream._36_4_ = 0;
  stream.avail_in = 0;
  stream._12_4_ = 0;
  stream.total_in = 0;
  auStack_a8 = (undefined1  [8])0x0;
  stream.next_in = (Bytef *)0x0;
  stream.reserved = (uLong)this;
  iVar3 = inflateInit2_(auStack_a8,0xf,"1.2.11",0x70);
  if (iVar3 != 0) {
    pEVar6 = (Exception *)__cxa_allocate_exception(0x1a0);
    memset((Exception *)(xferbuf + 0x7ff8),0,0x1a0);
    Exception::Exception((Exception *)(xferbuf + 0x7ff8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&stack0xfffffffffffffdc0,"inflateInit2 failed",0x13);
    Exception::Exception(pEVar6,(Exception *)(xferbuf + 0x7ff8));
    __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
  }
  stream.next_out = (Bytef *)CONCAT44(stream.next_out._4_4_,(int)inflatedSize);
  stream.total_in = (uLong)(this->super_MemReader).data;
  lVar10 = 0;
  bVar8 = false;
  do {
    if (((int)stream.next_in == 0) && (!bVar8)) {
      uVar4 = (*upstream->_vptr_Reader[2])(upstream,lVar10,0x8000,(string *)local_8248);
      stream.next_in = (Bytef *)CONCAT44(stream.next_in._4_4_,uVar4);
      bVar7 = true;
      if (uVar4 != 0) {
        bVar7 = bVar8;
      }
      lVar10 = lVar10 + (ulong)uVar4;
      auStack_a8 = (undefined1  [8])local_8248;
      bVar8 = bVar7;
    }
    iVar3 = inflate(auStack_a8);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    inflateEnd(auStack_a8);
    return;
  }
  pEVar6 = (Exception *)__cxa_allocate_exception(0x1a0);
  memset((Exception *)(xferbuf + 0x7ff8),0,0x1a0);
  Exception::Exception((Exception *)(xferbuf + 0x7ff8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&stack0xfffffffffffffdc0,"inflate failed",0xe);
  Exception::Exception(pEVar6,(Exception *)(xferbuf + 0x7ff8));
  __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

InflateReader::InflateReader(size_t inflatedSize, const Reader &upstream)
    : MemReader(std::string("inflated content from ") + stringify(upstream),
          inflatedSize, new char[inflatedSize])
{
    char xferbuf[32768];

    z_stream stream{};

    int window = 15;
    if (inflateInit2(&stream, window) != Z_OK)
        throw (Exception() << "inflateInit2 failed");

    stream.avail_out = inflatedSize;
    using bytep = Bytef *;
    stream.next_out = bytep(data);
    bool eof = false;
    size_t inputOffset = 0;
    for (bool done = false; !done; ) {
        if (stream.avail_in == 0 && !eof) {
            // keep the input buffer full
            stream.avail_in = upstream.read(inputOffset, sizeof xferbuf, xferbuf);
            inputOffset += stream.avail_in;
            stream.next_in = bytep(xferbuf);
            if (stream.avail_in == 0)
                eof = true;
        }
        switch (inflate(&stream, eof ? Z_FINISH : Z_SYNC_FLUSH)) {
            case Z_STREAM_END:
                done = true;
                // fallthrough
            case Z_OK:
                break;
            default:
                throw (Exception() << "inflate failed");
        }
    }
    inflateEnd(&stream);
}